

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void reindexDatabases(Parse *pParse,char *zColl)

{
  sqlite3 *psVar1;
  int iVar2;
  Db *pDVar3;
  HashElem *pHVar4;
  
  psVar1 = pParse->db;
  pDVar3 = psVar1->aDb;
  for (iVar2 = 0; iVar2 < psVar1->nDb; iVar2 = iVar2 + 1) {
    pHVar4 = (HashElem *)&(pDVar3->pSchema->tblHash).first;
    while (pHVar4 = pHVar4->next, pHVar4 != (HashElem *)0x0) {
      reindexTable(pParse,(Table *)pHVar4->data,zColl);
    }
    pDVar3 = pDVar3 + 1;
  }
  return;
}

Assistant:

static void reindexDatabases(Parse *pParse, char const *zColl){
  Db *pDb;                    /* A single database */
  int iDb;                    /* The database index number */
  sqlite3 *db = pParse->db;   /* The database connection */
  HashElem *k;                /* For looping over tables in pDb */
  Table *pTab;                /* A table in the database */

  assert( sqlite3BtreeHoldsAllMutexes(db) );  /* Needed for schema access */
  for(iDb=0, pDb=db->aDb; iDb<db->nDb; iDb++, pDb++){
    assert( pDb!=0 );
    for(k=sqliteHashFirst(&pDb->pSchema->tblHash);  k; k=sqliteHashNext(k)){
      pTab = (Table*)sqliteHashData(k);
      reindexTable(pParse, pTab, zColl);
    }
  }
}